

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ncons.cc
# Opt level: O0

int nc_dn(X509_NAME *nm,X509_NAME *base)

{
  int iVar1;
  X509_NAME *base_local;
  X509_NAME *nm_local;
  
  if ((nm->modified != 0) && (iVar1 = i2d_X509_NAME((X509_NAME *)nm,(uchar **)0x0), iVar1 < 0)) {
    return 0x11;
  }
  if ((base->modified != 0) && (iVar1 = i2d_X509_NAME((X509_NAME *)base,(uchar **)0x0), iVar1 < 0))
  {
    return 0x11;
  }
  if (nm->canon_enclen < base->canon_enclen) {
    nm_local._4_4_ = 0x2f;
  }
  else {
    iVar1 = OPENSSL_memcmp(base->canon_enc,nm->canon_enc,(long)base->canon_enclen);
    if (iVar1 == 0) {
      nm_local._4_4_ = 0;
    }
    else {
      nm_local._4_4_ = 0x2f;
    }
  }
  return nm_local._4_4_;
}

Assistant:

static int nc_dn(X509_NAME *nm, X509_NAME *base) {
  // Ensure canonical encodings are up to date.
  if (nm->modified && i2d_X509_NAME(nm, NULL) < 0) {
    return X509_V_ERR_OUT_OF_MEM;
  }
  if (base->modified && i2d_X509_NAME(base, NULL) < 0) {
    return X509_V_ERR_OUT_OF_MEM;
  }
  if (base->canon_enclen > nm->canon_enclen) {
    return X509_V_ERR_PERMITTED_VIOLATION;
  }
  if (OPENSSL_memcmp(base->canon_enc, nm->canon_enc, base->canon_enclen)) {
    return X509_V_ERR_PERMITTED_VIOLATION;
  }
  return X509_V_OK;
}